

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial_array.h
# Opt level: O3

void __thiscall
embree::sse2::
HeuristicArraySpatialSAH<embree::sse2::QuadSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
moveExtentedRange(HeuristicArraySpatialSAH<embree::sse2::QuadSplitterFactory,_embree::PrimRef,_32UL,_16UL>
                  *this,PrimInfoExtRange *set,PrimInfoExtRange *lset,PrimInfoExtRange *rset)

{
  unsigned_long *puVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  char cVar6;
  runtime_error *prVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  size_t left_ext_range_size;
  size_t right_size;
  task_group_context context;
  auto_partitioner local_f1;
  ulong local_f0;
  ulong local_e8;
  anon_class_8_1_898bcfc2 local_e0;
  anon_class_16_2_00979706 local_d8;
  blocked_range<unsigned_long> local_c8;
  task_group_context local_b0;
  
  uVar2 = (lset->super_extended_range<unsigned_long>)._ext_end;
  uVar3 = (lset->super_extended_range<unsigned_long>).super_range<unsigned_long>._end;
  local_f0 = uVar2 - uVar3;
  uVar4 = (rset->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin;
  uVar5 = (rset->super_extended_range<unsigned_long>).super_range<unsigned_long>._end;
  local_e8 = uVar5 - uVar4;
  uVar8 = uVar2 - uVar3;
  if (uVar8 != 0) {
    local_d8.this =
         (HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>
          *)this;
    local_c8.my_begin = uVar4;
    if (uVar8 < local_e8) {
      local_d8.left_ext_range_size = &local_e8;
      local_b0.my_version = proxy_support;
      local_b0.my_traits = (context_traits)0x4;
      local_b0.my_node.my_prev_node = (intrusive_list_node *)0x0;
      local_b0.my_node.my_next_node = (intrusive_list_node *)0x0;
      local_b0.my_name = CUSTOM_CTX;
      tbb::detail::r1::initialize(&local_b0);
      local_c8.my_grainsize = 0x40;
      local_e0.func = &local_d8;
      local_c8.my_end = uVar4 + uVar8;
      tbb::detail::d1::
      start_for<tbb::detail::d1::blocked_range<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/../builders/../../common/algorithms/parallel_for.h:70:73),_const_tbb::detail::d1::auto_partitioner>
      ::run(&local_c8,(anon_class_8_1_898bcfc2 *)&local_e0,&local_f1,&local_b0);
      cVar6 = tbb::detail::r1::is_group_execution_cancelled(&local_b0);
      if (cVar6 != '\0') {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar7,"task cancelled");
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy(&local_b0);
      local_f0 = uVar8;
    }
    else {
      local_d8.left_ext_range_size = &local_f0;
      local_b0.my_version = proxy_support;
      local_b0.my_traits = (context_traits)0x4;
      local_b0.my_node.my_prev_node = (intrusive_list_node *)0x0;
      local_b0.my_node.my_next_node = (intrusive_list_node *)0x0;
      local_b0.my_name = CUSTOM_CTX;
      tbb::detail::r1::initialize(&local_b0);
      local_c8.my_grainsize = 0x40;
      local_e0.func = &local_d8;
      local_c8.my_end = uVar5;
      tbb::detail::d1::
      start_for<tbb::detail::d1::blocked_range<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/../builders/../../common/algorithms/parallel_for.h:70:73),_const_tbb::detail::d1::auto_partitioner>
      ::run(&local_c8,&local_e0,&local_f1,&local_b0);
      cVar6 = tbb::detail::r1::is_group_execution_cancelled(&local_b0);
      if (cVar6 != '\0') {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar7,"task cancelled");
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy(&local_b0);
    }
    auVar9._8_4_ = (int)local_f0;
    auVar9._0_8_ = local_f0;
    auVar9._12_4_ = (int)(local_f0 >> 0x20);
    uVar2 = (rset->super_extended_range<unsigned_long>).super_range<unsigned_long>._end;
    (rset->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin =
         local_f0 + (rset->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin;
    (rset->super_extended_range<unsigned_long>).super_range<unsigned_long>._end =
         auVar9._8_8_ + uVar2;
    puVar1 = &(rset->super_extended_range<unsigned_long>)._ext_end;
    *puVar1 = *puVar1 + local_f0;
  }
  return;
}

Assistant:

__noinline void moveExtentedRange(const PrimInfoExtRange& set, const PrimInfoExtRange& lset, PrimInfoExtRange& rset)
        {
          const size_t left_ext_range_size = lset.ext_range_size();
          const size_t right_size = rset.size();

          /* has the left child an extended range? */
          if (left_ext_range_size > 0)
          {
            /* left extended range smaller than right range ? */
            if (left_ext_range_size < right_size)
            {
              /* only move a small part of the beginning of the right range to the end */
              parallel_for( rset.begin(), rset.begin()+left_ext_range_size, MOVE_STEP_SIZE, [&](const range<size_t>& r) {                  
                  for (size_t i=r.begin(); i<r.end(); i++)
                    prims0[i+right_size] = prims0[i];
                });
            }
            else
            {
              /* no overlap, move entire right range to new location, can be made fully parallel */
              parallel_for( rset.begin(), rset.end(), MOVE_STEP_SIZE,  [&](const range<size_t>& r) {
                  for (size_t i=r.begin(); i<r.end(); i++)
                    prims0[i+left_ext_range_size] = prims0[i];
                });
            }
            /* update right range */
            assert(rset.ext_end() + left_ext_range_size == set.ext_end());
            rset.move_right(left_ext_range_size);
          }
        }